

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O1

uint * meshopt::hashLookup<unsigned_int,meshopt::VertexHasher>
                 (uint *table,size_t buckets,VertexHasher *hash,uint *key,uint *empty)

{
  uint uVar1;
  ulong __n;
  uchar *puVar2;
  size_t sVar3;
  uint *puVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  uint *local_48;
  
  uVar9 = buckets - 1;
  uVar1 = *key;
  __n = hash->vertex_size;
  uVar8 = 0;
  if (3 < __n) {
    piVar6 = (int *)(hash->vertices + hash->vertex_stride * (ulong)uVar1);
    uVar7 = __n;
    do {
      uVar8 = uVar8 * 0x5bd1e995 ^
              ((uint)(*piVar6 * 0x5bd1e995) >> 0x18 ^ *piVar6 * 0x5bd1e995) * 0x5bd1e995;
      piVar6 = piVar6 + 1;
      uVar7 = uVar7 - 4;
    } while (3 < uVar7);
  }
  uVar7 = (ulong)(uVar8 & (uint)uVar9);
  uVar8 = *empty;
  puVar2 = hash->vertices;
  sVar3 = hash->vertex_stride;
  uVar10 = 0;
  while( true ) {
    puVar4 = table + uVar7;
    if (*puVar4 == uVar8) {
      bVar11 = false;
    }
    else {
      iVar5 = bcmp(puVar2 + *puVar4 * sVar3,puVar2 + uVar1 * sVar3,__n);
      bVar11 = iVar5 != 0;
      if (bVar11) {
        uVar7 = uVar7 + uVar10 + 1 & uVar9;
        puVar4 = local_48;
      }
    }
    local_48 = puVar4;
    if (!bVar11) break;
    uVar10 = uVar10 + 1;
    if (uVar9 < uVar10) {
      return (uint *)0x0;
    }
  }
  return local_48;
}

Assistant:

static T* hashLookup(T* table, size_t buckets, const Hash& hash, const T& key, const T& empty)
{
	assert(buckets > 0);
	assert((buckets & (buckets - 1)) == 0);

	size_t hashmod = buckets - 1;
	size_t bucket = hash.hash(key) & hashmod;

	for (size_t probe = 0; probe <= hashmod; ++probe)
	{
		T& item = table[bucket];

		if (item == empty)
			return &item;

		if (hash.equal(item, key))
			return &item;

		// hash collision, quadratic probing
		bucket = (bucket + probe + 1) & hashmod;
	}

	assert(false && "Hash table is full"); // unreachable
	return 0;
}